

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maplayers.cpp
# Opt level: O0

void PlaceEggDoodads(int LayerWidth,int LayerHeight,CTile *aOutTiles,CTile *aGameLayerTiles,
                    int ItemWidth,int ItemHeight,int *aImageTileID,int ImageTileIDCount,int Freq)

{
  undefined4 uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  int in_R9D;
  long in_stack_00000008;
  int Tid_1;
  int ix_1;
  int iy_1;
  int BaskerStartID;
  int DownTid;
  int Tid;
  int ix;
  int iy;
  bool HasGround;
  bool ObstructedByWall;
  bool Overlap;
  int x;
  int y;
  int local_48;
  int local_44;
  int local_34;
  int local_30;
  int local_28;
  int local_24;
  
  local_24 = 0;
  do {
    if (in_ESI - in_R9D <= local_24) {
      return;
    }
    for (local_28 = 0; local_28 < in_EDI - in_R8D; local_28 = local_28 + 1) {
      bVar2 = false;
      bVar3 = false;
      bVar4 = true;
      for (local_30 = 0; local_30 < in_R9D; local_30 = local_30 + 1) {
        for (local_34 = 0; local_34 < in_R8D; local_34 = local_34 + 1) {
          iVar5 = (local_24 + local_30) * in_EDI + local_28 + local_34;
          if (*(char *)(in_RDX + (long)iVar5 * 4) != '\0') {
            bVar2 = true;
            break;
          }
          if (*(char *)(in_RCX + (long)iVar5 * 4) == '\x01') {
            bVar3 = true;
            break;
          }
          if ((local_30 == in_R9D + -1) &&
             (*(char *)(in_RCX + (long)((local_24 + local_30 + 1) * in_EDI + local_28 + local_34) *
                                 4) != '\x01')) {
            bVar4 = false;
            break;
          }
        }
      }
      if ((((!bVar2) && (!bVar3)) && (bVar4)) && (iVar5 = random_int(), iVar5 % BaskerStartID == 0))
      {
        iVar5 = random_int();
        uVar1 = *(undefined4 *)(in_stack_00000008 + (long)(iVar5 % ix_1) * 4);
        for (local_44 = 0; local_44 < in_R9D; local_44 = local_44 + 1) {
          for (local_48 = 0; local_48 < in_R8D; local_48 = local_48 + 1) {
            *(char *)(in_RDX + (long)((local_24 + local_44) * in_EDI + local_28 + local_48) * 4) =
                 (char)uVar1 + (char)(local_44 << 4) + (char)local_48;
          }
        }
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

static void PlaceEggDoodads(int LayerWidth, int LayerHeight, CTile* aOutTiles, CTile* aGameLayerTiles, int ItemWidth, int ItemHeight, const int* aImageTileID, int ImageTileIDCount, int Freq)
{
	for(int y = 0; y < LayerHeight-ItemHeight; y++)
	{
		for(int x = 0; x < LayerWidth-ItemWidth; x++)
		{
			bool Overlap = false;
			bool ObstructedByWall = false;
			bool HasGround = true;

			for(int iy = 0; iy < ItemHeight; iy++)
			{
				for(int ix = 0; ix < ItemWidth; ix++)
				{
					int Tid = (y+iy) * LayerWidth + (x+ix);
					int DownTid = (y+iy+1) * LayerWidth + (x+ix);

					if(aOutTiles[Tid].m_Index != 0)
					{
						Overlap = true;
						break;
					}

					if(aGameLayerTiles[Tid].m_Index == 1)
					{
						ObstructedByWall = true;
						break;
					}

					if(iy == ItemHeight-1 && aGameLayerTiles[DownTid].m_Index != 1)
					{
						HasGround = false;
						break;
					}
				}
			}

			if(!Overlap && !ObstructedByWall && HasGround && random_int()%Freq == 0)
			{
				const int BaskerStartID = aImageTileID[random_int()%ImageTileIDCount];

				for(int iy = 0; iy < ItemHeight; iy++)
				{
					for(int ix = 0; ix < ItemWidth; ix++)
					{
						int Tid = (y+iy) * LayerWidth + (x+ix);
						aOutTiles[Tid].m_Index = BaskerStartID + iy * 16 + ix;
					}
				}
			}
		}
	}
}